

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkt-proc-builder.cpp
# Opt level: O3

void __thiscall
yactfr::internal::SaveValInstrInserterVisitor::visit
          (SaveValInstrInserterVisitor *this,BeginReadDlBlobInstr *instr)

{
  unsigned_long_long uVar1;
  
  if ((this->_func).super__Function_base._M_manager != (_Manager_type)0x0) {
    uVar1 = (*(this->_func)._M_invoker)
                      ((_Any_data *)&this->_func,
                       (unordered_set<const_yactfr::DataType_*,_std::hash<const_yactfr::DataType_*>,_std::equal_to<const_yactfr::DataType_*>,_std::allocator<const_yactfr::DataType_*>_>
                        *)&(instr->super_ReadDataInstr)._dt[3]._attrs);
    instr->_lenPos = uVar1;
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void visit(BeginReadVarUIntSelInstr& instr) override
    {
        this->_visitBeginReadVarInstr(instr);
    }